

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O2

int Toupper(int ucs)

{
  int iVar1;
  unsigned_short *puVar2;
  long lVar3;
  
  if (Toupper::table == (unsigned_short *)0x0) {
    puVar2 = (unsigned_short *)malloc(0x20000);
    Toupper::table = puVar2;
    for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 1) {
      puVar2[lVar3] = (unsigned_short)lVar3;
    }
    for (lVar3 = 0; lVar3 != 0x10000; lVar3 = lVar3 + 1) {
      iVar1 = XUtf8Tolower((int)lVar3);
      if (lVar3 != iVar1) {
        Toupper::table[iVar1] = (unsigned_short)lVar3;
      }
    }
  }
  if ((uint)ucs < 0x10000) {
    ucs = (int)Toupper::table[(uint)ucs];
  }
  return ucs;
}

Assistant:

static int Toupper(int ucs) {
  long i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(
	    sizeof(unsigned short) * (NBC));
    for (i = 0; i < NBC; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < NBC; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= NBC || ucs < 0) return ucs;
  return table[ucs];
}